

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)5>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             int *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  string_view s;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar7 = (uint)uVar4;
      *ptr = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar7);
  }
  *ptr = (byte)uVar4;
  pbVar9 = ptr + 1;
  uVar7 = (uint)key->_M_string_length;
  uVar6 = uVar7 | 1;
  iVar2 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  lVar3 = 0x3f;
  if (((long)*value | 1U) != 0) {
    for (; ((long)*value | 1U) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar6 = (iVar2 * 9 + 0x49U >> 6) + uVar7 + ((int)lVar3 * 9 + 0x49U >> 6) + 2;
  uVar7 = uVar6;
  if (0x7f < uVar6) {
    do {
      *pbVar9 = (byte)uVar7 | 0x80;
      uVar6 = uVar7 >> 7;
      pbVar9 = pbVar9 + 1;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  *pbVar9 = (byte)uVar6;
  pbVar9 = pbVar9 + 1;
  if (stream->end_ <= pbVar9) {
    pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar9);
  }
  __n = key->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)pbVar9)))) {
    *pbVar9 = 10;
    pbVar9[1] = (byte)__n;
    memcpy(pbVar9 + 2,(key->_M_dataplus)._M_p,__n);
    pbVar9 = pbVar9 + __n + 2;
  }
  else {
    s._M_str = (key->_M_dataplus)._M_p;
    s._M_len = __n;
    pbVar9 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,pbVar9);
  }
  if (stream->end_ <= pbVar9) {
    pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar9);
  }
  uVar8 = (ulong)*value;
  pbVar5 = pbVar9 + 1;
  *pbVar9 = 0x10;
  uVar4 = uVar8;
  if (0x7f < uVar8) {
    do {
      *pbVar5 = (byte)uVar4 | 0x80;
      uVar8 = uVar4 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar8;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar8;
  return pbVar5 + 1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }